

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h264e_vepu580.c
# Opt level: O0

MPP_RET hal_h264e_vepu580_gen_regs(void *hal,HalEncTask *task)

{
  HalVepu580RegSet *regs_00;
  MppEncCfgSet *enc_cfg;
  H264eSps *sps_00;
  H264ePps *pps_00;
  H264eSlice *slice_00;
  EncRcTask *rc_task_00;
  RK_U32 RVar1;
  MPP_RET MVar2;
  EncFrmStatus *pEVar3;
  RK_U32 local_74;
  EncFrmStatus *frm_status;
  MPP_RET ret;
  EncFrmStatus *frm;
  EncRcTask *rc_task;
  H264eSlice *slice;
  H264ePps *pps;
  H264eSps *sps;
  MppEncCfgSet *cfg;
  HalVepu580RegSet *regs;
  HalH264eVepu580Ctx *ctx;
  HalEncTask *task_local;
  void *hal_local;
  
  regs_00 = *(HalVepu580RegSet **)((long)hal + 0x1d0);
  enc_cfg = *hal;
  sps_00 = *(H264eSps **)((long)hal + 0x60);
  pps_00 = *(H264ePps **)((long)hal + 0x68);
  slice_00 = *(H264eSlice **)((long)hal + 0x1e8);
  rc_task_00 = task->rc_task;
  pEVar3 = &task->rc_task->frm;
  if ((hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu580","enter %p\n","hal_h264e_vepu580_gen_regs",hal);
  }
  if ((hal_h264e_debug & 8) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu580","frame %d generate regs now","hal_h264e_vepu580_gen_regs",
               (ulong)**(uint **)((long)hal + 0x78));
  }
  memset(regs_00,0,0x1cb8);
  setup_vepu580_normal(regs_00);
  hal_local._4_4_ = setup_vepu580_prep(regs_00,(MppEncPrepCfg *)(*hal + 8),task);
  if (hal_local._4_4_ == MPP_OK) {
    setup_vepu580_dual_core((HalH264eVepu580Ctx *)hal,slice_00->slice_type);
    setup_vepu580_codec(regs_00,sps_00,pps_00,slice_00);
    setup_vepu580_rdo_pred(regs_00,sps_00,pps_00,slice_00);
    setup_vepu580_rdo_cfg(&regs_00->reg_rdo);
    setup_vepu580_rdo_bias_cfg(&regs_00->reg_rdo,&enc_cfg->hw);
    memcpy(&regs_00->reg_scl,vepu580_540_h264_flat_scl_tab,0x900);
    setup_vepu580_rc_base(regs_00,(HalH264eVepu580Ctx *)hal,rc_task_00);
    setup_vepu580_io_buf(regs_00,*(MppDevRegOffCfgs **)((long)hal + 0x38),task);
    setup_vepu580_roi(regs_00,(HalH264eVepu580Ctx *)hal);
    setup_vepu580_recn_refr((HalH264eVepu580Ctx *)hal,regs_00);
    if (task->md_info == (MppBuffer)0x0) {
      local_74 = 0;
    }
    else {
      local_74 = mpp_buffer_get_fd_with_caller(task->md_info,"hal_h264e_vepu580_gen_regs");
    }
    (regs_00->reg_base).meiw_addr = local_74;
    (regs_00->reg_base).enc_pic =
         (anon_struct_4_12_9a467a88_for_enc_pic)
         ((uint)(regs_00->reg_base).enc_pic & 0xfffffff7 |
         (uint)(task->md_info != (MppBuffer)0x0) << 3);
    RVar1 = mpp_frame_get_offset_y(task->frame);
    (regs_00->reg_base).pic_ofst =
         (anon_struct_4_4_fd8500c5_for_pic_ofst)
         ((uint)(regs_00->reg_base).pic_ofst & 0xc000ffff | (RVar1 & 0x3fff) << 0x10);
    RVar1 = mpp_frame_get_offset_x(task->frame);
    (regs_00->reg_base).pic_ofst =
         (anon_struct_4_4_fd8500c5_for_pic_ofst)
         ((uint)(regs_00->reg_base).pic_ofst & 0xffffc000 | RVar1 & 0x3fff);
    setup_vepu580_split(regs_00,enc_cfg);
    setup_vepu580_me(regs_00,sps_00,slice_00);
    if ((pEVar3->val >> 0x26 & 1) != 0) {
      setup_vepu580_intra_refresh
                (regs_00,(HalH264eVepu580Ctx *)hal,
                 (RK_U32)((long)(pEVar3->val >> 0x30) % (long)(enc_cfg->rc).gop));
    }
    if (((((enc_cfg->tune).deblur_en != 0) && ((rc_task_00->info).complex_scene == 0)) &&
        ((enc_cfg->rc).rc_mode == MPP_ENC_RC_MODE_SMTRC)) &&
       (((enc_cfg->tune).scene_mode == MPP_ENC_SCENE_MODE_IPC &&
        (MVar2 = setup_vepu580_qpmap_buf((HalH264eVepu580Ctx *)hal), MVar2 != MPP_OK)))) {
      _mpp_log_l(2,"hal_h264e_vepu580","qpmap malloc buffer failed!\n",(char *)0x0);
    }
    vepu580_set_osd((Vepu541OsdCfg *)((long)hal + 0x138));
    setup_vepu580_l2(regs_00,slice_00,&enc_cfg->hw);
    setup_vepu580_ext_line_buf(regs_00,(HalH264eVepu580Ctx *)hal);
    vepu580_h264e_tune_reg_patch(*(void **)((long)hal + 0x168));
    if (((rc_task_00->frm).val >> 2 & 1) != 0) {
      vepu580_h264e_save_pass1_patch(regs_00,(HalH264eVepu580Ctx *)hal);
    }
    if (((rc_task_00->frm).val >> 3 & 1) != 0) {
      vepu580_h264e_use_pass1_patch(regs_00,(HalH264eVepu580Ctx *)hal);
    }
    *(int *)((long)hal + 0x10) = *(int *)((long)hal + 0x10) + 1;
    if ((hal_h264e_debug & 2) != 0) {
      _mpp_log_l(4,"hal_h264e_vepu580","leave %p\n","hal_h264e_vepu580_gen_regs",hal);
    }
    hal_local._4_4_ = MPP_OK;
  }
  return hal_local._4_4_;
}

Assistant:

static MPP_RET hal_h264e_vepu580_gen_regs(void *hal, HalEncTask *task)
{
    HalH264eVepu580Ctx *ctx = (HalH264eVepu580Ctx *)hal;
    HalVepu580RegSet *regs = ctx->regs_set;
    MppEncCfgSet *cfg = ctx->cfg;
    H264eSps *sps = ctx->sps;
    H264ePps *pps = ctx->pps;
    H264eSlice *slice = ctx->slice;
    EncRcTask *rc_task = task->rc_task;
    EncFrmStatus *frm = &rc_task->frm;
    MPP_RET ret = MPP_OK;
    EncFrmStatus *frm_status = &task->rc_task->frm;

    hal_h264e_dbg_func("enter %p\n", hal);
    hal_h264e_dbg_detail("frame %d generate regs now", ctx->frms->seq_idx);

    /* register setup */
    memset(regs, 0, sizeof(*regs));

    setup_vepu580_normal(regs);
    ret = setup_vepu580_prep(regs, &ctx->cfg->prep, task);
    if (ret)
        return ret;

    setup_vepu580_dual_core(ctx, slice->slice_type);
    setup_vepu580_codec(regs, sps, pps, slice);
    setup_vepu580_rdo_pred(regs, sps, pps, slice);
    setup_vepu580_rdo_cfg(&regs->reg_rdo);
    setup_vepu580_rdo_bias_cfg(&regs->reg_rdo, &cfg->hw);

    // scl cfg
    memcpy(&regs->reg_scl, vepu580_540_h264_flat_scl_tab, sizeof(vepu580_540_h264_flat_scl_tab));

    setup_vepu580_rc_base(regs, ctx, rc_task);
    setup_vepu580_io_buf(regs, ctx->offsets, task);
    setup_vepu580_roi(regs, ctx);
    setup_vepu580_recn_refr(ctx, regs);

    regs->reg_base.meiw_addr = task->md_info ? mpp_buffer_get_fd(task->md_info) : 0;
    regs->reg_base.enc_pic.mei_stor = task->md_info ? 1 : 0;
    regs->reg_base.pic_ofst.pic_ofst_y = mpp_frame_get_offset_y(task->frame);
    regs->reg_base.pic_ofst.pic_ofst_x = mpp_frame_get_offset_x(task->frame);

    setup_vepu580_split(regs, cfg);
    setup_vepu580_me(regs, sps, slice);

    if (frm_status->is_i_refresh)
        setup_vepu580_intra_refresh(regs, ctx, frm_status->seq_idx % cfg->rc.gop);

    if (cfg->tune.deblur_en && (!rc_task->info.complex_scene) &&
        cfg->rc.rc_mode == MPP_ENC_RC_MODE_SMTRC &&
        cfg->tune.scene_mode == MPP_ENC_SCENE_MODE_IPC) {
        if (MPP_OK != setup_vepu580_qpmap_buf(ctx))
            mpp_err("qpmap malloc buffer failed!\n");
    }

    vepu580_set_osd(&ctx->osd_cfg);
    setup_vepu580_l2(regs, slice, &cfg->hw);
    setup_vepu580_ext_line_buf(regs, ctx);
    vepu580_h264e_tune_reg_patch(ctx->tune);

    /* two pass register patch */
    if (frm->save_pass1)
        vepu580_h264e_save_pass1_patch(regs, ctx);

    if (frm->use_pass1)
        vepu580_h264e_use_pass1_patch(regs, ctx);

    ctx->frame_cnt++;

    hal_h264e_dbg_func("leave %p\n", hal);
    return MPP_OK;
}